

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_NamedArg_Test::TestBody(FormatterTest_NamedArg_Test *this)

{
  bool bVar1;
  named_arg<int,_char> *args_1;
  named_arg<int,_char> *pnVar2;
  char *pcVar3;
  named_arg<int,_char> *in_R9;
  named_arg<int,_char> *in_stack_fffffffffffffbb8;
  AssertionResult gtest_ar_1;
  string gtest_expected_message;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_5;
  int local_388 [16];
  AssertionResult gtest_ar;
  named_arg<int,_char> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  named_arg<int,_char> local_2b8;
  named_arg<int,_char> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  named_arg<int,_char> local_228;
  named_arg<int,_char> local_1f0;
  named_arg<int,_char> local_1b8;
  named_arg<int,_char> local_180;
  named_arg<int,_char> local_148;
  named_arg<int,_char> local_110;
  named_arg<int,_char> local_d8;
  named_arg<int,_char> local_a0;
  named_arg<int,_char> local_68;
  
  local_2b8.super_named_arg_base<char>.name.data_ =
       (char *)CONCAT71(local_2b8.super_named_arg_base<char>.name.data_._1_7_,0x61);
  gtest_expected_message._M_dataplus._M_p = "a_";
  gtest_expected_message._M_string_length = 2;
  gtest_ar_1._0_8_ = anon_var_dwarf_2a12d;
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_280.super_named_arg_base<char>.name.data_ =
       (char *)CONCAT44(local_280.super_named_arg_base<char>.name.data_._4_4_,1);
  gtest_ar_2._0_8_ = anon_var_dwarf_2a147;
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  fmt::v5::
  format<char[15],fmt::v5::internal::named_arg<char,char>,fmt::v5::internal::named_arg<char[2],char>,fmt::v5::internal::named_arg<int,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_310,
             (v5 *)"{_1}/{a_}/{A_}",(char (*) [15])&gtest_expected_message,
             (named_arg<char,_char> *)&gtest_ar_1,(named_arg<char[2],_char> *)&gtest_ar_2,in_R9);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"1/a/A\"",
             "format(\"{_1}/{a_}/{A_}\", fmt::arg(\"a_\", \'a\'), fmt::arg(\"A_\", \"A\"), fmt::arg(\"_1\", 1))"
             ,(char (*) [6])"1/a/A",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x336,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar_1.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"argument not found",(allocator *)&gtest_ar_2);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[4]>(&local_248,(char (*) [4])"{a}");
      std::__cxx11::string::~string((string *)&local_248);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_1,
               (char (*) [95])
               "Expected: format(\"{a}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar_1.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pnVar2 = (named_arg<int,_char> *)0x1f94d9;
  }
  else {
    pnVar2 = (named_arg<int,_char> *)((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x337,(char *)pnVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_ar_2,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  local_310.super_named_arg_base<char>.name.data_ =
       (char *)CONCAT44(local_310.super_named_arg_base<char>.name.data_._4_4_,0xffffffd6);
  gtest_ar._0_4_ = 4;
  gtest_expected_message._M_dataplus._M_p = "width";
  gtest_expected_message._M_string_length = 5;
  args_1 = (named_arg<int,_char> *)&gtest_ar_1;
  fmt::v5::format<char[12],int,fmt::v5::internal::named_arg<int,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
             (v5 *)"{0:{width}}",(char (*) [12])&local_310,(int *)&gtest_expected_message,pnVar2);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\" -42\"",
             "format(\"{0:{width}}\", -42, fmt::arg(\"width\", 4))",(char (*) [5])0x1ea561,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      args_1 = (named_arg<int,_char> *)0x1f94d9;
    }
    else {
      args_1 = (named_arg<int,_char> *)((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x338,(char *)args_1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_310.super_named_arg_base<char>.name.data_ =
       (char *)CONCAT44(local_310.super_named_arg_base<char>.name.data_._4_4_,2);
  gtest_expected_message._M_dataplus._M_p = "precision";
  gtest_expected_message._M_string_length = 9;
  pnVar2 = (named_arg<int,_char> *)&gtest_ar_1;
  fmt::v5::format<char[17],char[4],fmt::v5::internal::named_arg<int,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pnVar2,
             (v5 *)"{0:.{precision}}",(char (*) [17])"str",(char (*) [4])&gtest_expected_message,
             args_1);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"st\"",
             "format(\"{0:.{precision}}\", \"str\", fmt::arg(\"precision\", 2))",
             (char (*) [3])0x1e4792,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pnVar2);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pnVar2 = (named_arg<int,_char> *)0x1f94d9;
    }
    else {
      pnVar2 = (named_arg<int,_char> *)((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x339,(char *)pnVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_310.super_named_arg_base<char>.name.data_ =
       (char *)CONCAT44(local_310.super_named_arg_base<char>.name.data_._4_4_,1);
  gtest_ar._0_4_ = 2;
  gtest_expected_message._M_dataplus._M_p = "two";
  gtest_expected_message._M_string_length = 3;
  fmt::v5::format<char[9],int,fmt::v5::internal::named_arg<int,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1,
             (v5 *)"{} {two}",(char (*) [9])&local_310,(int *)&gtest_expected_message,pnVar2);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar_2,"\"1 2\"","format(\"{} {two}\", 1, fmt::arg(\"two\", 2))",
             (char (*) [4])"1 2",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x33a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_388[0xf] = 0;
  gtest_expected_message._M_dataplus._M_p = "a";
  gtest_expected_message._M_string_length = 1;
  local_388[0xe] = 0;
  gtest_ar_1._0_8_ = (long)"\\b" + 1;
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_388[0xd] = 0x2a;
  gtest_ar_2._0_8_ = (long)"    c" + 4;
  local_310.value = local_388 + 0xc;
  local_388[0xc] = 0;
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_310.super_named_arg_base<char>.name.data_ = "d";
  local_310.super_named_arg_base<char>.name.size_ = 1;
  local_388[0xb] = 0;
  gtest_ar._0_8_ = (long)"%e" + 1;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_280.value = local_388 + 10;
  local_388[10] = 0;
  local_280.super_named_arg_base<char>.name.data_ = "f";
  local_280.super_named_arg_base<char>.name.size_ = 1;
  local_2b8.value = local_388 + 9;
  local_388[9] = 0;
  local_2b8.super_named_arg_base<char>.name.data_ = "g";
  local_2b8.super_named_arg_base<char>.name.size_ = 1;
  local_228.value = local_388 + 8;
  local_388[8] = 0;
  local_228.super_named_arg_base<char>.name.data_ = "h";
  local_228.super_named_arg_base<char>.name.size_ = 1;
  local_68.value = local_388 + 7;
  local_388[7] = 0;
  local_68.super_named_arg_base<char>.name.data_ = "i";
  local_68.super_named_arg_base<char>.name.size_ = 1;
  local_a0.value = local_388 + 6;
  local_388[6] = 0;
  local_a0.super_named_arg_base<char>.name.data_ = "j";
  local_d8.value = local_388 + 5;
  local_388[5] = 0;
  local_a0.super_named_arg_base<char>.name.size_ = 1;
  local_d8.super_named_arg_base<char>.name.data_ = "k";
  local_d8.super_named_arg_base<char>.name.size_ = 1;
  local_110.value = local_388 + 4;
  local_388[4] = 0;
  local_110.super_named_arg_base<char>.name.data_ = "l";
  local_110.super_named_arg_base<char>.name.size_ = 1;
  local_148.value = local_388 + 3;
  local_388[3] = 0;
  local_148.super_named_arg_base<char>.name.data_ = "m";
  local_148.super_named_arg_base<char>.name.size_ = 1;
  local_180.value = local_388 + 2;
  local_388[2] = 0;
  local_180.super_named_arg_base<char>.name.data_ = "n";
  local_1b8.value = local_388 + 1;
  local_388[1] = 0;
  local_180.super_named_arg_base<char>.name.size_ = 1;
  local_1b8.super_named_arg_base<char>.name.data_ = "o";
  local_1b8.super_named_arg_base<char>.name.size_ = 1;
  local_1f0.value = local_388;
  local_388[0] = 0;
  local_1f0.super_named_arg_base<char>.name.data_ = "p";
  local_1f0.super_named_arg_base<char>.name.size_ = 1;
  fmt::v5::
  format<char[4],fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>,fmt::v5::internal::named_arg<int,char>>
            (&local_2d8,(v5 *)"{c}",(char (*) [4])&gtest_expected_message,
             (named_arg<int,_char> *)&gtest_ar_1,(named_arg<int,_char> *)&gtest_ar_2,&local_310,
             (named_arg<int,_char> *)&gtest_ar,&local_280,&local_2b8,&local_228,&local_68,&local_a0,
             &local_d8,&local_110,&local_148,&local_180,&local_1b8,&local_1f0,
             in_stack_fffffffffffffbb8);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar_5,"\"42\"",
             "format(\"{c}\", fmt::arg(\"a\", 0), fmt::arg(\"b\", 0), fmt::arg(\"c\", 42), fmt::arg(\"d\", 0), fmt::arg(\"e\", 0), fmt::arg(\"f\", 0), fmt::arg(\"g\", 0), fmt::arg(\"h\", 0), fmt::arg(\"i\", 0), fmt::arg(\"j\", 0), fmt::arg(\"k\", 0), fmt::arg(\"l\", 0), fmt::arg(\"m\", 0), fmt::arg(\"n\", 0), fmt::arg(\"o\", 0), fmt::arg(\"p\", 0))"
             ,(char (*) [3])0x1f1bef,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x33f,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  return;
}

Assistant:

TEST(FormatterTest, NamedArg) {
  EXPECT_EQ("1/a/A", format("{_1}/{a_}/{A_}", fmt::arg("a_", 'a'),
                            fmt::arg("A_", "A"), fmt::arg("_1", 1)));
  EXPECT_THROW_MSG(format("{a}"), format_error, "argument not found");
  EXPECT_EQ(" -42", format("{0:{width}}", -42, fmt::arg("width", 4)));
  EXPECT_EQ("st", format("{0:.{precision}}", "str", fmt::arg("precision", 2)));
  EXPECT_EQ("1 2", format("{} {two}", 1, fmt::arg("two", 2)));
  EXPECT_EQ("42", format("{c}",
        fmt::arg("a", 0), fmt::arg("b", 0), fmt::arg("c", 42), fmt::arg("d", 0),
        fmt::arg("e", 0), fmt::arg("f", 0), fmt::arg("g", 0), fmt::arg("h", 0),
        fmt::arg("i", 0), fmt::arg("j", 0), fmt::arg("k", 0), fmt::arg("l", 0),
        fmt::arg("m", 0), fmt::arg("n", 0), fmt::arg("o", 0), fmt::arg("p", 0)));
}